

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::FixTrailingCommas::fix_comma
          (FixTrailingCommas *this,Fodder *last_comma_fodder,bool *trailing_comma,
          Fodder *close_fodder)

{
  bool bVar1;
  Fodder *in_RDX;
  Fodder *in_RSI;
  Fodder *in_RDI;
  bool need_comma;
  bool local_22;
  
  bVar1 = contains_newline(in_RDI);
  local_22 = true;
  if (!bVar1) {
    local_22 = contains_newline(in_RDI);
  }
  if (((ulong)(in_RDX->
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              )._M_impl.super__Vector_impl_data._M_start & 1) == 0) {
    if (local_22 != false) {
      *(undefined1 *)
       &(in_RDX->
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        )._M_impl.super__Vector_impl_data._M_start = 1;
    }
  }
  else if (local_22 == false) {
    *(undefined1 *)
     &(in_RDX->
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      )._M_impl.super__Vector_impl_data._M_start = 0;
    fodder_move_front(in_RSI,in_RDX);
  }
  else {
    bVar1 = contains_newline(in_RDI);
    if (bVar1) {
      fodder_move_front(in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

void fix_comma(Fodder &last_comma_fodder, bool &trailing_comma, Fodder &close_fodder)
    {
        bool need_comma = contains_newline(close_fodder) || contains_newline(last_comma_fodder);
        if (trailing_comma) {
            if (!need_comma) {
                // Remove it but keep fodder.
                trailing_comma = false;
                fodder_move_front(close_fodder, last_comma_fodder);
            } else if (contains_newline(last_comma_fodder)) {
                // The comma is needed but currently is separated by a newline.
                fodder_move_front(close_fodder, last_comma_fodder);
            }
        } else {
            if (need_comma) {
                // There was no comma, but there was a newline before the ] so add a comma.
                trailing_comma = true;
            }
        }
    }